

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

void fe_dct2(fe_t *fe,powspec_t *mflogspec,mfcc_t *mfcep,int htk)

{
  byte bVar1;
  uint uVar2;
  melfb_t *pmVar3;
  mfcc_t *pmVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  mfcc_t mVar8;
  
  *mfcep = (mfcc_t)(float)(double)*mflogspec;
  pmVar3 = fe->mel_fb;
  uVar2 = pmVar3->num_filters;
  if (1 < (long)(int)uVar2) {
    mVar8 = *mfcep;
    lVar5 = 1;
    do {
      mVar8 = (mfcc_t)(float)((double)(float)mVar8 + (double)mflogspec[lVar5]);
      lVar5 = lVar5 + 1;
    } while ((int)uVar2 != lVar5);
    *mfcep = mVar8;
  }
  *mfcep = (mfcc_t)((float)*mfcep * (float)(&pmVar3->sqrt_inv_n)[htk != 0]);
  bVar1 = fe->num_cepstra;
  if (1 < (ulong)bVar1) {
    uVar6 = 1;
    do {
      mfcep[uVar6] = 0.0;
      if (0 < (int)uVar2) {
        pmVar4 = pmVar3->mel_cosine[uVar6];
        mVar8 = mfcep[uVar6];
        uVar7 = 0;
        do {
          mVar8 = (mfcc_t)(float)((double)(float)pmVar4[uVar7] * (double)mflogspec[uVar7] +
                                 (double)(float)mVar8);
          mfcep[uVar6] = mVar8;
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      mfcep[uVar6] = (mfcc_t)((float)mfcep[uVar6] * (float)pmVar3->sqrt_inv_2n);
      uVar6 = uVar6 + 1;
    } while (uVar6 != bVar1);
  }
  return;
}

Assistant:

void
fe_dct2(fe_t * fe, const powspec_t * mflogspec, mfcc_t * mfcep, int htk)
{
    int32 i, j;

    /* Compute C0 separately (its basis vector is 1) to avoid
     * costly multiplications. */
    mfcep[0] = mflogspec[0];
    for (j = 1; j < fe->mel_fb->num_filters; j++)
        mfcep[0] += mflogspec[j];
    if (htk)
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_2n);
    else                        /* sqrt(1/N) = sqrt(2/N) * 1/sqrt(2) */
        mfcep[0] = COSMUL(mfcep[0], fe->mel_fb->sqrt_inv_n);

    for (i = 1; i < fe->num_cepstra; ++i) {
        mfcep[i] = 0;
        for (j = 0; j < fe->mel_fb->num_filters; j++) {
            mfcep[i] += COSMUL(mflogspec[j], fe->mel_fb->mel_cosine[i][j]);
        }
        mfcep[i] = COSMUL(mfcep[i], fe->mel_fb->sqrt_inv_2n);
    }
}